

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::location_contents(Parser *this,Location *loc)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  csubstr cVar7;
  char *pcStack_58;
  size_t local_50;
  char msg [39];
  
  uVar6 = (loc->super_LineCol).offset;
  uVar5 = (this->m_buf).len;
  if (uVar5 <= uVar6) {
    builtin_strncpy(msg,"check failed: (loc.offset < m_buf.len)",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        cVar7 = (csubstr)(*pcVar2)();
        return cVar7;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar7.len;
    pcStack_58 = cVar7.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7f8e) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7f8e) << 0x40,8);
    LVar3.name.str = pcStack_58;
    LVar3.name.len = local_50;
    (*p_Var1)(msg,0x27,LVar3,(this->m_stack).m_callbacks.m_user_data);
    uVar6 = (loc->super_LineCol).offset;
    uVar5 = (this->m_buf).len;
  }
  if (uVar6 <= uVar5) {
    basic_substring<char>::basic_substring
              ((basic_substring<char> *)msg,(this->m_buf).str + uVar6,uVar5 - uVar6);
    cVar7.len._0_1_ = msg[8];
    cVar7.len._1_1_ = msg[9];
    cVar7.len._2_1_ = msg[10];
    cVar7.len._3_1_ = msg[0xb];
    cVar7.len._4_1_ = msg[0xc];
    cVar7.len._5_1_ = msg[0xd];
    cVar7.len._6_1_ = msg[0xe];
    cVar7.len._7_1_ = msg[0xf];
    cVar7.str = (char *)msg._0_8_;
    return cVar7;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar4 = is_debugger_attached();
    if (bVar4) {
      pcVar2 = (code *)swi(3);
      cVar7 = (csubstr)(*pcVar2)();
      return cVar7;
    }
  }
  handle_error(0x20a4ad,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

csubstr Parser::location_contents(Location const& loc) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, loc.offset < m_buf.len);
    return m_buf.sub(loc.offset);
}